

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O3

string * cpp_client::anon_unknown_7::handle_itr
                   (string *__return_storage_ptr__,Base_game *context,Delta_mergable *apply_to,
                   ConstMemberIterator *itr,Delta_mergable *owner,
                   vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *refs,vec_ref_t *vec_refs,string *owner_name)

{
  pointer *pppVar1;
  uint uVar2;
  Pointer this;
  char *pcVar3;
  size_t __n;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var4;
  _func_int **pp_Var5;
  Member *this_00;
  element_type *peVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  long *plVar9;
  int iVar10;
  Ch *pCVar11;
  undefined4 extraout_var;
  const_iterator cVar12;
  ostream *poVar13;
  ostream *poVar14;
  mapped_type *pmVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  undefined *puVar17;
  undefined8 *puVar18;
  string *extraout_RAX;
  string *psVar19;
  mapped_type *pmVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppVar21;
  runtime_error *this_02;
  pointer *__ptr;
  Member *pMVar22;
  pointer *__ptr_2;
  Delta_mergable *pDVar23;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_03;
  pointer ppVar24;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar25;
  ConstMemberIterator data_iter;
  element_type *local_100;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  to_edit;
  string str;
  int num;
  undefined4 uStack_b4;
  vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
  *local_b0;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  temp_refs;
  shared_ptr<cpp_client::Base_object> ptr;
  Delta_mergable *owner_local;
  string name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long *local_38;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  
  this = itr->ptr_;
  local_b0 = (vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
              *)refs;
  owner_local = owner;
  pCVar11 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString(&this->name);
  std::__cxx11::string::string((string *)&name,pCVar11,(allocator *)&str);
  iVar10 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])(context);
  this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)CONCAT44(extraout_var,iVar10);
  uVar2 = (this->value).flags_;
  if (uVar2 == 0) {
    pmVar15 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)apply_to->variables_,&name);
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length = 0;
    _Var4._M_head_impl =
         (pmVar15->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    if ((_Var4._M_head_impl != (holder *)0x0) &&
       ((*(_Var4._M_head_impl)->_vptr_holder[5])(_Var4._M_head_impl,&str), str._M_string_length != 0
       )) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_string_length);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pGVar25 = &this->value;
    if (uVar2 == 3) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&str,(Ch *)pGVar25);
      _Var7 = str._M_dataplus;
      str._M_string_length = 0xe;
      str.field_2._M_allocated_capacity._0_4_ = 0x100005;
      str._M_dataplus._M_p = "gameObjectName";
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&to_edit,pGVar25);
      ppVar21 = to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      str._M_string_length = 2;
      str.field_2._M_allocated_capacity._0_4_ = 0x100005;
      str._M_dataplus._M_p = "id";
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&to_edit,pGVar25);
      if ((this->value).flags_ == 3) {
        this_03 = (this->value).data_.a.elements;
        if ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)_Var7._M_p == this_03 + (ulong)(this->value).data_.s.length * 2) {
          if (ppVar21 == (pointer)_Var7._M_p) {
            if (to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var7._M_p) {
              pCVar11 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                     *)&to_edit.
                                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].second);
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,pCVar11,(allocator *)&str);
              if (owner_name->_M_string_length == 0) {
                str._M_dataplus._M_p = (pointer)apply_to;
                to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)apply_to->variables_,&name);
                std::
                vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                ::
                emplace_back<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string_const&>
                          (local_b0,(Delta_mergable **)&str,(Any **)&to_edit,&name,
                           __return_storage_ptr__);
              }
              goto LAB_001203ce;
            }
            pppVar1 = &to_edit.
                       super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            do {
              ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)this_03;
              if (this_03 ==
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((this->value).data_.s.str + (ulong)(this->value).data_.s.length * 0x30))
              goto LAB_001203b0;
              pCVar11 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetString(this_03);
              std::__cxx11::string::string((string *)&str,pCVar11,(allocator *)&to_edit);
              pGVar25 = this_03 + 1;
              if (this_03[1].flags_ == 3) {
                to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe;
                to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(to_edit.
                                       super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       0x100005);
                to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_41d16;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&temp_refs,pGVar25);
                if (this_03[1].flags_ != 3) break;
                if (temp_refs.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (pointer)(this_03[1].data_.s.str + (ulong)this_03[1].data_.s.length * 0x30)) {
                  iVar10 = (*apply_to->_vptr_Delta_mergable[4])(apply_to,&name);
                  pDVar23 = owner_local;
                  to_edit.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppVar1;
                  if ((char)iVar10 == '\0') {
                    data_iter.ptr_ = (Pointer)0x0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&to_edit,name._M_dataplus._M_p,
                               name._M_dataplus._M_p + name._M_string_length);
                    Any::Any<std::__cxx11::string>((Any *)&num,(string *)&to_edit);
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
                      operator_delete(to_edit.
                                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    (*pDVar23->_vptr_Delta_mergable[3])
                              ((string *)&to_edit,pDVar23,owner_name,&num,&data_iter);
                    if ((long *)(to_edit.
                                 super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first == (long *)0x0) {
                      temp_refs.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      temp_refs.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_00120a20:
                      ppVar21 = to_edit.
                                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if ((long *)(to_edit.
                                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first != (long *)0x0)
                      {
                        (**(code **)(*(long *)(to_edit.
                                               super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first + 8
                                    ))();
                      }
                      operator_delete(ppVar21);
                    }
                    else {
                      (**(code **)(*(long *)(to_edit.
                                             super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first +
                                  0x30))(&temp_refs);
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                      goto LAB_00120a20;
                    }
                    handle_itr((string *)&to_edit,context,
                               (Delta_mergable *)
                               temp_refs.
                               super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,(ConstMemberIterator *)&ptr
                               ,pDVar23,(vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_b0,vec_refs,owner_name);
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      iVar10 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])();
                      pmVar20 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)CONCAT44(extraout_var_00,iVar10),&name);
                      local_100 = (pmVar20->
                                  super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr;
                      iVar10 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])();
                      pmVar20 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)CONCAT44(extraout_var_01,iVar10),&name);
                      local_48._M_allocated_capacity =
                           (size_type)
                           std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)(((pmVar20->
                                             super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr)->super_Delta_mergable).variables_,&str);
                      std::
                      vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                      ::
                      emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string&>
                                (local_b0,&local_100,(Any **)&local_48._M_allocated_capacity,&str,
                                 (string *)&to_edit);
                    }
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
                      operator_delete(to_edit.
                                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (temp_refs.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 temp_refs.
                                 super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                    }
                  }
                  else {
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&to_edit,str._M_dataplus._M_p,
                               str._M_dataplus._M_p + str._M_string_length);
                    Any::Any<std::__cxx11::string>((Any *)&data_iter,(string *)&to_edit);
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
                      operator_delete(to_edit.
                                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    _num = (holder *)0x0;
                    (*apply_to->_vptr_Delta_mergable[3])(&local_100,apply_to,&name,&data_iter,&num);
                    pp_Var5 = (local_100->super_Delta_mergable)._vptr_Delta_mergable;
                    puVar17 = &void::typeinfo;
                    if (pp_Var5 != (_func_int **)0x0) {
                      puVar17 = (undefined *)(**(code **)(*pp_Var5 + 0x10))();
                    }
                    pcVar3 = *(char **)(puVar17 + 8);
                    if ((pcVar3 == "St10shared_ptrIN10cpp_client11Base_objectEE") ||
                       ((*pcVar3 != '*' &&
                        (iVar10 = strcmp(pcVar3,"St10shared_ptrIN10cpp_client11Base_objectEE"),
                        iVar10 == 0)))) {
                      pp_Var5 = (local_100->super_Delta_mergable)._vptr_Delta_mergable;
                      if (pp_Var5 == (_func_int **)0x0) {
LAB_00120b17:
                        peVar6 = local_100;
                        ppVar21 = (pointer)operator_new(0x28);
                        (ppVar21->second).data_._M_t.
                        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                             (holder *)0x100000001;
                        ppVar21->first = (unsigned_long)&PTR___Sp_counted_ptr_inplace_0013a4b0;
                        ppVar24 = ppVar21 + 1;
                        Base_object::Base_object((Base_object *)ppVar24);
                        pp_Var5 = (peVar6->super_Delta_mergable)._vptr_Delta_mergable;
                        to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = ppVar24;
                        to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = ppVar21;
                        if ((pp_Var5 == (_func_int **)0x0) ||
                           ((**(code **)(*pp_Var5 + 0x28))(pp_Var5,(string *)&to_edit),
                           to_edit.
                           super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     to_edit.
                                     super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                        }
                      }
                      else {
                        (**(code **)(*pp_Var5 + 0x30))((string *)&to_edit);
                        ppVar21 = to_edit.
                                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if (to_edit.
                            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     to_edit.
                                     super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        if (ppVar21 == (pointer)0x0) goto LAB_00120b17;
                      }
                      (**(code **)(*(local_100->super_Delta_mergable)._vptr_Delta_mergable + 0x30))
                                (&temp_refs);
                      handle_itr((string *)&to_edit,context,
                                 (Delta_mergable *)
                                 temp_refs.
                                 super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (ConstMemberIterator *)&ptr,apply_to,
                                 (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_b0,vec_refs,&name);
                      (*apply_to->_vptr_Delta_mergable[3])(&local_38,apply_to,&name,&data_iter,&num)
                      ;
                      plVar9 = local_38;
                      if (local_38 != (long *)0x0) {
                        if ((long *)*local_38 != (long *)0x0) {
                          (**(code **)(*(long *)*local_38 + 8))();
                        }
                        operator_delete(plVar9);
                      }
                      local_38 = (long *)0x0;
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                        local_48._M_allocated_capacity =
                             (size_type)
                             std::__detail::
                             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                           *)apply_to->variables_,&name);
                        std::
                        vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                        ::
                        emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                                  (local_b0,&owner_local,(Any **)&local_48._M_allocated_capacity,
                                   &str,(string *)&to_edit);
                      }
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
                        operator_delete(to_edit.
                                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (temp_refs.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   temp_refs.
                                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                      }
                    }
                    else {
                      morph_any((Any *)local_100,pGVar25);
                      (*apply_to->_vptr_Delta_mergable[3])
                                (local_48._M_local_buf + 8,apply_to,&name,&data_iter,local_100);
                      uVar8 = local_48._8_8_;
                      if ((long *)local_48._8_8_ != (long *)0x0) {
                        if (*(long **)local_48._8_8_ != (long *)0x0) {
                          (**(code **)(**(long **)local_48._8_8_ + 8))();
                        }
                        operator_delete((void *)uVar8);
                      }
                      local_48._8_8_ = (long *)0x0;
                    }
                    peVar6 = local_100;
                    if (local_100 != (element_type *)0x0) {
                      pp_Var5 = (local_100->super_Delta_mergable)._vptr_Delta_mergable;
                      if (pp_Var5 != (_func_int **)0x0) {
                        (**(code **)(*pp_Var5 + 8))();
                      }
                      operator_delete(peVar6);
                    }
                  }
                  if ((_Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                       )_num != (holder *)0x0) {
                    (*_num->_vptr_holder[1])();
                  }
                  if (data_iter.ptr_ != (Pointer)0x0) {
                    (**(code **)((long)&((((data_iter.ptr_)->name).data_.o.members)->name).data_ + 8
                                ))();
                  }
                }
                else {
                  handle_itr((string *)&to_edit,context,apply_to,(ConstMemberIterator *)&ptr,
                             owner_local,
                             (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_b0,vec_refs,owner_name);
                  if (to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    temp_refs.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)owner_local->variables_,&name);
                    std::
                    vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                    ::
                    emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                              (local_b0,&owner_local,(Any **)&temp_refs,&str,(string *)&to_edit);
                  }
                  if (to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
                    operator_delete(to_edit.
                                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
              }
              else {
                pmVar15 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)apply_to->variables_,&str);
                morph_any(pmVar15,pGVar25);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)str._M_dataplus._M_p != &str.field_2) {
                operator_delete(str._M_dataplus._M_p);
              }
              this_03 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)(ptr.
                            super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 2);
              ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)this_03;
            } while ((this->value).flags_ == 3);
          }
          else {
            pCVar11 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   *)&ppVar21[1].second);
            std::__cxx11::string::string((string *)&str,pCVar11,(allocator *)&temp_refs);
            (*(context->super_Delta_mergable)._vptr_Delta_mergable[9])(&to_edit,context,&str);
            pmVar20 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](this_01,&name);
            ppVar24 = to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppVar21 = to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            to_edit.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            to_edit.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            p_Var16 = (pmVar20->
                      super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            (pmVar20->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr = (element_type *)ppVar21;
            (pmVar20->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar24;
            if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
            }
            if (to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         to_edit.
                         super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)str._M_dataplus._M_p != &str.field_2) {
              operator_delete(str._M_dataplus._M_p);
            }
            if ((this->value).flags_ != 3) goto LAB_00120d33;
            pGVar25 = (pGVar25->data_).a.elements;
            do {
              temp_refs.
              super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar25;
              if (pGVar25 ==
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((this->value).data_.s.str + (ulong)(this->value).data_.s.length * 0x30))
              goto LAB_001203b0;
              pmVar20 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](this_01,&name);
              handle_itr(&str,context,
                         &((pmVar20->
                           super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_Delta_mergable,(ConstMemberIterator *)&temp_refs,apply_to,
                         (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b0,vec_refs,&name);
              if (str._M_string_length != 0) {
                pCVar11 = rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::GetString(pGVar25);
                std::__cxx11::string::string((string *)&to_edit,pCVar11,(allocator *)&ptr);
                pmVar20 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[](this_01,&name);
                ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (pmVar20->
                     super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                ;
                pmVar20 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[](this_01,&name);
                data_iter.ptr_ =
                     (Pointer)std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)(((pmVar20->
                                                super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->super_Delta_mergable).variables_,
                                           (key_type *)&to_edit);
                std::
                vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                ::
                emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string&,std::__cxx11::string&>
                          (local_b0,(Base_object **)&ptr,(Any **)&data_iter,(key_type *)&to_edit,
                           &str);
                if (to_edit.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (pointer)&to_edit.
                              super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(to_edit.
                                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)str._M_dataplus._M_p != &str.field_2) {
                operator_delete(str._M_dataplus._M_p);
              }
              pGVar25 = pGVar25 + 2;
              temp_refs.
              super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar25;
            } while ((this->value).flags_ == 3);
          }
        }
        else {
          if ((_Var7._M_p[0x29] & 4U) == 0) {
            __assert_fail("flags_ & kIntFlag",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                          ,0x594,
                          "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          (**apply_to->_vptr_Delta_mergable)(apply_to,&name,(long)*(int *)(_Var7._M_p + 0x18));
          to_edit.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          to_edit.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          to_edit.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_refs.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_refs.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          temp_refs.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if ((this->value).flags_ != 3) {
LAB_00120d33:
            __assert_fail("IsObject()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                          ,0x35e,
                          "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          this_00 = (pGVar25->data_).o.members;
          do {
            pMVar22 = this_00 + 1;
            data_iter.ptr_ = this_00;
            if (this_00 ==
                (Member *)((this->value).data_.s.str + (ulong)(this->value).data_.s.length * 0x30))
            {
              (*apply_to->_vptr_Delta_mergable[1])(apply_to,&name,&to_edit);
              if (temp_refs.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  temp_refs.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                str._M_dataplus._M_p = (pointer)apply_to;
                std::
                vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
                ::
                emplace_back<cpp_client::Base_object*,std::__cxx11::string_const&,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>
                          ((vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
                            *)vec_refs,(Base_object **)&str,&name,&temp_refs);
              }
              std::
              vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
              ::~vector(&temp_refs);
              std::
              vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
              ::~vector(&to_edit);
              goto LAB_001203b0;
            }
            if (this_00 != (Member *)_Var7._M_p) {
              if ((this_00->value).flags_ == 3) {
                p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
                p_Var16->_M_use_count = 1;
                p_Var16->_M_weak_count = 1;
                p_Var16->_vptr__Sp_counted_base =
                     (_func_int **)&PTR___Sp_counted_ptr_inplace_0013a4b0;
                pDVar23 = (Delta_mergable *)(p_Var16 + 1);
                Base_object::Base_object((Base_object *)pDVar23);
                ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)pDVar23;
                ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = p_Var16;
                handle_itr(&str,context,pDVar23,&data_iter,apply_to,
                           (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_b0,vec_refs,&name);
                pCVar11 = rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::GetString(&this_00->name);
                iVar10 = atoi(pCVar11);
                num = iVar10;
                if (str._M_string_length == 0) {
                  std::
                  vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                  ::emplace_back<int_const&,std::shared_ptr<cpp_client::Base_object>>
                            ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                              *)&to_edit,&num,&ptr);
                }
                else {
                  std::
                  vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                  ::emplace_back<int_const&,std::__cxx11::string>
                            ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                              *)&temp_refs,&num,&str);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str._M_dataplus._M_p != &str.field_2) {
                  operator_delete(str._M_dataplus._M_p);
                }
                if (ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              else {
                str._M_dataplus._M_p = (pointer)0x0;
                morph_any((Any *)&str,&this_00->value);
                puVar17 = &void::typeinfo;
                if (str._M_dataplus._M_p != (pointer)0x0) {
                  puVar17 = (undefined *)(**(code **)(*(long *)str._M_dataplus._M_p + 0x10))();
                }
                pcVar3 = *(char **)(puVar17 + 8);
                if ((pcVar3 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
                   ((*pcVar3 != '*' &&
                    (iVar10 = strcmp(pcVar3,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
                    iVar10 == 0)))) {
                  puVar18 = (undefined8 *)(**(code **)(*(long *)str._M_dataplus._M_p + 0x18))();
                  __n = puVar18[1];
                  if ((__n != (context->remove_string_)._M_string_length) ||
                     ((__n != 0 &&
                      (iVar10 = bcmp((void *)*puVar18,(context->remove_string_)._M_dataplus._M_p,__n
                                    ), iVar10 != 0)))) goto LAB_0012025f;
                }
                else {
LAB_0012025f:
                  pCVar11 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::GetString(&this_00->name);
                  iVar10 = atoi(pCVar11);
                  ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)
                         CONCAT44(ptr.
                                  super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._4_4_,iVar10);
                  std::
                  vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                  ::emplace_back<int,cpp_client::Any>
                            ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                              *)&to_edit,(int *)&ptr,(Any *)&str);
                }
                if (str._M_dataplus._M_p != (pointer)0x0) {
                  (**(code **)(*(long *)str._M_dataplus._M_p + 8))();
                }
              }
            }
            this_00 = pMVar22;
            data_iter.ptr_ = pMVar22;
          } while ((this->value).flags_ == 3);
        }
      }
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                    ,0x361,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (uVar2 == 4) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Received a JSON array in a delta.");
      *(undefined ***)this_02 = &PTR__runtime_error_0013a110;
      __cxa_throw(this_02,&Bad_response::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pGVar25);
      iVar10 = std::__cxx11::string::compare((char *)&context->remove_string_);
      if (iVar10 == 0) {
        Delta_mergable::erase(owner_local,&name);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_001203ce;
      }
    }
    cVar12 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&apply_to->variables_->_M_h,&name);
    if ((cVar12.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_true>
         ._M_cur == (__node_type *)0x0) &&
       (iVar10 = std::__cxx11::string::compare((char *)&name), iVar10 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[",2);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"m",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Warning: Unknown variable ",0x1a);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," added.",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[",2);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"m",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    }
    pmVar15 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)apply_to->variables_,&name);
    morph_any(pmVar15,pGVar25);
LAB_001203b0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
LAB_001203ce:
  psVar19 = (string *)&name.field_2;
  if ((string *)name._M_dataplus._M_p != psVar19) {
    operator_delete(name._M_dataplus._M_p);
    psVar19 = extraout_RAX;
  }
  return psVar19;
}

Assistant:

inline std::string
   handle_itr(Base_game& context,
              Delta_mergable& apply_to,
              const rapidjson::Value::ConstMemberIterator& itr,
              Delta_mergable* owner,
              std::vector<std::tuple<Delta_mergable*, Any*, std::string, std::string>>& refs,
              vec_ref_t& vec_refs,
              const std::string& owner_name)
{
   const auto& val = itr->value;
   const auto name = std::string(itr->name.GetString());
   auto& objects = context.get_objects();
   //check if it's an object
   if(val.IsObject())
   {
      //check if it's an "array"
      auto len_itr = val.FindMember(context.len_string().c_str());
      auto type_itr = val.FindMember("gameObjectName");
      auto id_itr = val.FindMember("id");
      if(len_itr != val.MemberEnd())
      {
         //array...
         //grab the length
         auto size = attr_wrapper::as<int>(len_itr->value);
         //resize the vector
         apply_to.resize(name, size);
         std::vector<std::pair<std::size_t, Any>> to_edit;
         std::vector<std::pair<std::size_t, Any>> temp_refs;
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            //skip the length iterator
            if(data_iter == len_itr)
            {
               continue;
            }
            //either a game object or a primitive - if it's an object it's a game object
            if(data_iter->value.IsObject())
            {
               //make a base object and then edit it
               auto ptr = std::make_shared<Base_object>();
               auto str = handle_itr(context,
                                     *ptr,
                                     data_iter,
                                     &apply_to,
                                     refs,
                                     vec_refs,
                                     name);
               const auto num = atoi(data_iter->name.GetString());
               if(!str.empty())
               {
                  temp_refs.emplace_back(num, std::move(str));
               }
               else
               {
                  to_edit.emplace_back(num, std::move(ptr));
               }
            }
            else
            {
               Any to_add;
               morph_any(to_add, data_iter->value);
               bool add = true;
               //if it's the remove state remove ignore it
               if(to_add.type() == typeid(std::string))
               {
                  add = (to_add.as<std::string>() != context.remove_string());
               }
               if(add)
               {
                  to_edit.emplace_back(atoi(data_iter->name.GetString()),
                                       std::move(to_add));
               }
            }
         }
         apply_to.change_vec_values(name, to_edit);
         //put vector object references in there too (if non-empty)
         if(!temp_refs.empty())
         {
            vec_refs.emplace_back(static_cast<Base_object*>(&apply_to),
                                  name,
                                  std::move(temp_refs));
         }
      }
      else if(type_itr != val.MemberEnd())
      {
         //new object...
         //give it a place in the objects
         objects[name] = context.generate_object(attr_wrapper::as<std::string>(type_itr->value));
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            auto str = handle_itr(context,
                                  *objects[name],
                                  data_iter,
                                  &apply_to,
                                  refs,
                                  vec_refs,
                                  name);
            if(!str.empty())
            {
               auto target = std::string{data_iter->name.GetString()};
               refs.emplace_back(objects[name].get(),
                                 &objects[name]->variables_[target],
                                 target,
                                 str);
            }
         }
      }
      else if(id_itr != val.MemberEnd())
      {
         const auto ref = attr_wrapper::as<std::string>(id_itr->value);
         if(owner_name.empty())
         {
            //object reference...
            refs.emplace_back(&apply_to,
                              &apply_to.variables_[name],
                              name,
                              ref);
         }
         return ref;
      }
      else
      {
         //map...
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            const auto target = std::string{data_iter->name.GetString()};
            if(data_iter->value.IsObject())
            {
               //see if it is a new object
               const auto name_iter = data_iter->value.FindMember("gameObjectName");
               if(name_iter != data_iter->value.MemberEnd())
               {
                  auto str = handle_itr(context,
                                        apply_to,
                                        data_iter,
                                        owner,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     refs.emplace_back(owner,
                                       &owner->variables_[name],
                                       target,
                                       std::move(str));
                  }
               }
               else if(!apply_to.is_map(name))
               {
                  auto owner2 = static_cast<Base_object*>(owner);
                  Any dummy;
                  Any key = std::string{name};
                  auto self = owner2->add_key_value(owner_name, key, dummy)->get();
                  auto str = handle_itr(context,
                                        *self,
                                        data_iter,
                                        owner2,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     // str is the id of the object to bind to
                     // target is the field name
                     // name is the id of the object to manipulate
                     refs.emplace_back(context.get_objects()[name].get(),
                                       &context.get_objects()[name]->variables_[target],
                                       target,
                                       str);
                  }
               }
               else
               {
                  //need to handle object references
                  Any key{std::string{target}};
                  Any dummy{};
                  auto value = apply_to.add_key_value(name, key, dummy);
                  if(value->type() == typeid(std::shared_ptr<Base_object>))
                  {
                     //make an object if needed
                     if(!value->get())
                     {
                        value->reset(std::make_shared<Base_object>());
                     }
                     auto self = value->get();
                     auto str = handle_itr(context,
                                           *self,
                                           data_iter,
                                           &apply_to,
                                           refs,
                                           vec_refs,
                                           name);
                     apply_to.add_key_value(name, key, dummy);
                     if(!str.empty())
                     {
                        refs.emplace_back(owner,
                                          &apply_to.variables_[name],
                                          target,
                                          std::move(str));
                     }
                  }
                  else
                  {
                     //otherwise just morph it
                     morph_any(*value, data_iter->value);
                     apply_to.add_key_value(name, key, *value);
                  }
               }
            }
            else
            {
               morph_any(apply_to.variables_[target], data_iter->value);
            }
         }
      }
   }
   else if(!val.IsArray())
   {
      if(val.IsNull())
      {
         apply_to.variables_[name].reset();
         return "";
      }
      else if(val.IsString() && val.GetString() == context.remove_string())
      {
         //remove this thing
         owner->erase(name);
         return "";
      }
      //do some checking (ignore name because of game weirdness)
      if(!apply_to.variables_.count(name) && name != "name")
      {
         std::cout << sgr::text_yellow
                   << "Warning: Unknown variable " << name << " added." << sgr::reset
                   << "\n"
                   ;
      }
      morph_any(apply_to.variables_[name], val);
   }
   else
   {
      //array - some kind of error
      throw Bad_response("Received a JSON array in a delta.");
   }
   return "";
}